

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtxParam_getParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int *value)

{
  int *value_local;
  ZSTD_cParameter param_local;
  ZSTD_CCtx_params *CCtxParams_local;
  
  if (param == ZSTD_c_experimentalParam2) {
    *value = CCtxParams->format;
  }
  else if (param == ZSTD_c_compressionLevel) {
    *value = CCtxParams->compressionLevel;
  }
  else if (param == ZSTD_c_windowLog) {
    *value = (CCtxParams->cParams).windowLog;
  }
  else if (param == ZSTD_c_hashLog) {
    *value = (CCtxParams->cParams).hashLog;
  }
  else if (param == ZSTD_c_chainLog) {
    *value = (CCtxParams->cParams).chainLog;
  }
  else if (param == ZSTD_c_searchLog) {
    *value = (CCtxParams->cParams).searchLog;
  }
  else if (param == ZSTD_c_minMatch) {
    *value = (CCtxParams->cParams).minMatch;
  }
  else if (param == ZSTD_c_targetLength) {
    *value = (CCtxParams->cParams).targetLength;
  }
  else if (param == ZSTD_c_strategy) {
    *value = (CCtxParams->cParams).strategy;
  }
  else if (param == ZSTD_c_enableLongDistanceMatching) {
    *value = (CCtxParams->ldmParams).enableLdm;
  }
  else if (param == ZSTD_c_ldmHashLog) {
    *value = (CCtxParams->ldmParams).hashLog;
  }
  else if (param == ZSTD_c_ldmMinMatch) {
    *value = (CCtxParams->ldmParams).minMatchLength;
  }
  else if (param == ZSTD_c_ldmBucketSizeLog) {
    *value = (CCtxParams->ldmParams).bucketSizeLog;
  }
  else if (param == ZSTD_c_ldmHashRateLog) {
    *value = (CCtxParams->ldmParams).hashRateLog;
  }
  else if (param == ZSTD_c_contentSizeFlag) {
    *value = (CCtxParams->fParams).contentSizeFlag;
  }
  else if (param == ZSTD_c_checksumFlag) {
    *value = (CCtxParams->fParams).checksumFlag;
  }
  else if (param == ZSTD_c_dictIDFlag) {
    *value = (uint)(((CCtxParams->fParams).noDictIDFlag != 0 ^ 0xffU) & 1);
  }
  else if (param == ZSTD_c_nbWorkers) {
    *value = CCtxParams->nbWorkers;
  }
  else {
    if (param == ZSTD_c_jobSize) {
      return 0xffffffffffffffd8;
    }
    if (param == ZSTD_c_overlapLog) {
      return 0xffffffffffffffd8;
    }
    if (param == ZSTD_c_experimentalParam1) {
      return 0xffffffffffffffd8;
    }
    if (param == ZSTD_c_experimentalParam3) {
      *value = CCtxParams->forceWindow;
    }
    else {
      if (param != ZSTD_c_experimentalParam4) {
        return 0xffffffffffffffd8;
      }
      *value = CCtxParams->attachDictPref;
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtxParam_getParameter(
        ZSTD_CCtx_params* CCtxParams, ZSTD_cParameter param, int* value)
{
    switch(param)
    {
    case ZSTD_c_format :
        *value = CCtxParams->format;
        break;
    case ZSTD_c_compressionLevel :
        *value = CCtxParams->compressionLevel;
        break;
    case ZSTD_c_windowLog :
        *value = CCtxParams->cParams.windowLog;
        break;
    case ZSTD_c_hashLog :
        *value = CCtxParams->cParams.hashLog;
        break;
    case ZSTD_c_chainLog :
        *value = CCtxParams->cParams.chainLog;
        break;
    case ZSTD_c_searchLog :
        *value = CCtxParams->cParams.searchLog;
        break;
    case ZSTD_c_minMatch :
        *value = CCtxParams->cParams.minMatch;
        break;
    case ZSTD_c_targetLength :
        *value = CCtxParams->cParams.targetLength;
        break;
    case ZSTD_c_strategy :
        *value = (unsigned)CCtxParams->cParams.strategy;
        break;
    case ZSTD_c_contentSizeFlag :
        *value = CCtxParams->fParams.contentSizeFlag;
        break;
    case ZSTD_c_checksumFlag :
        *value = CCtxParams->fParams.checksumFlag;
        break;
    case ZSTD_c_dictIDFlag :
        *value = !CCtxParams->fParams.noDictIDFlag;
        break;
    case ZSTD_c_forceMaxWindow :
        *value = CCtxParams->forceWindow;
        break;
    case ZSTD_c_forceAttachDict :
        *value = CCtxParams->attachDictPref;
        break;
    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        assert(CCtxParams->nbWorkers == 0);
#endif
        *value = CCtxParams->nbWorkers;
        break;
    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        assert(CCtxParams->jobSize <= INT_MAX);
        *value = (int)CCtxParams->jobSize;
        break;
#endif
    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        *value = CCtxParams->overlapLog;
        break;
#endif
    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        *value = CCtxParams->rsyncable;
        break;
#endif
    case ZSTD_c_enableLongDistanceMatching :
        *value = CCtxParams->ldmParams.enableLdm;
        break;
    case ZSTD_c_ldmHashLog :
        *value = CCtxParams->ldmParams.hashLog;
        break;
    case ZSTD_c_ldmMinMatch :
        *value = CCtxParams->ldmParams.minMatchLength;
        break;
    case ZSTD_c_ldmBucketSizeLog :
        *value = CCtxParams->ldmParams.bucketSizeLog;
        break;
    case ZSTD_c_ldmHashRateLog :
        *value = CCtxParams->ldmParams.hashRateLog;
        break;
    default: return ERROR(parameter_unsupported);
    }
    return 0;
}